

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pubkey.cpp
# Opt level: O1

void __thiscall
Pubkey_ConstructorExceptionTest_Test::~Pubkey_ConstructorExceptionTest_Test
          (Pubkey_ConstructorExceptionTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Pubkey, ConstructorExceptionTest) {
  pubkeyExceptionTest("");
  pubkeyExceptionTest("1234567890");
  pubkeyExceptionTest("ABCDEFGHIJKLMN");
  pubkeyExceptionTest(
      "011362bdf255b304dcd29bfdb6b5c63c68ef7df60e2b1fc156716efe077b794647");
  pubkeyExceptionTest(
      "021362zzz255z304zzz29zzzz6z5z63z68zz7zz60z2z1zz156716zzz077z794647");
}